

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

LIBSSH2_SESSION *
libssh2_session_init_ex
          (_func_void_ptr_size_t_void_ptr_ptr *my_alloc,_func_void_void_ptr_void_ptr_ptr *my_free,
          _func_void_ptr_void_ptr_size_t_void_ptr_ptr *my_realloc,void *abstract)

{
  LIBSSH2_SESSION *__s;
  LIBSSH2_SESSION *session;
  _func_void_ptr_void_ptr_size_t_void_ptr_ptr *local_realloc;
  _func_void_void_ptr_void_ptr_ptr *local_free;
  _func_void_ptr_size_t_void_ptr_ptr *local_alloc;
  void *abstract_local;
  _func_void_ptr_void_ptr_size_t_void_ptr_ptr *my_realloc_local;
  _func_void_void_ptr_void_ptr_ptr *my_free_local;
  _func_void_ptr_size_t_void_ptr_ptr *my_alloc_local;
  
  local_free = libssh2_default_alloc;
  local_realloc = libssh2_default_free;
  session = (LIBSSH2_SESSION *)libssh2_default_realloc;
  if (my_alloc != (_func_void_ptr_size_t_void_ptr_ptr *)0x0) {
    local_free = (_func_void_void_ptr_void_ptr_ptr *)my_alloc;
  }
  if (my_free != (_func_void_void_ptr_void_ptr_ptr *)0x0) {
    local_realloc = (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)my_free;
  }
  if (my_realloc != (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)0x0) {
    session = (LIBSSH2_SESSION *)my_realloc;
  }
  local_alloc = (_func_void_ptr_size_t_void_ptr_ptr *)abstract;
  abstract_local = my_realloc;
  my_realloc_local = (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)my_free;
  my_free_local = (_func_void_void_ptr_void_ptr_ptr *)my_alloc;
  __s = (LIBSSH2_SESSION *)(*local_free)((void *)0x13e68,&local_alloc);
  if (__s != (LIBSSH2_SESSION *)0x0) {
    memset(__s,0,0x13e68);
    __s->alloc = (_func_void_ptr_size_t_void_ptr_ptr *)local_free;
    __s->free = (_func_void_void_ptr_void_ptr_ptr *)local_realloc;
    __s->realloc = (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)session;
    __s->send = _libssh2_send;
    __s->recv = _libssh2_recv;
    __s->abstract = local_alloc;
    __s->api_timeout = 0;
    __s->api_block_mode = 1;
    __s->state = 1;
    __s->fullpacket_required_type = 0;
    __s->packet_read_timeout = 0x3c;
    (__s->flag).quote_paths = 1;
    __s->kex = (LIBSSH2_KEX_METHOD *)0x0;
    _libssh2_init_if_needed();
  }
  return __s;
}

Assistant:

LIBSSH2_API LIBSSH2_SESSION *
libssh2_session_init_ex(LIBSSH2_ALLOC_FUNC((*my_alloc)),
                        LIBSSH2_FREE_FUNC((*my_free)),
                        LIBSSH2_REALLOC_FUNC((*my_realloc)), void *abstract)
{
    LIBSSH2_ALLOC_FUNC((*local_alloc)) = libssh2_default_alloc;
    LIBSSH2_FREE_FUNC((*local_free)) = libssh2_default_free;
    LIBSSH2_REALLOC_FUNC((*local_realloc)) = libssh2_default_realloc;
    LIBSSH2_SESSION *session;

    if(my_alloc) {
        local_alloc = my_alloc;
    }
    if(my_free) {
        local_free = my_free;
    }
    if(my_realloc) {
        local_realloc = my_realloc;
    }

    session = local_alloc(sizeof(LIBSSH2_SESSION), &abstract);
    if(session) {
        memset(session, 0, sizeof(LIBSSH2_SESSION));
        session->alloc = local_alloc;
        session->free = local_free;
        session->realloc = local_realloc;
        session->send = _libssh2_send;
        session->recv = _libssh2_recv;
        session->abstract = abstract;
        session->api_timeout = 0; /* timeout-free API by default */
        session->api_block_mode = 1; /* blocking API by default */
        session->state = LIBSSH2_STATE_INITIAL_KEX;
        session->fullpacket_required_type = 0;
        session->packet_read_timeout = LIBSSH2_DEFAULT_READ_TIMEOUT;
        session->flag.quote_paths = 1; /* default behavior is to quote paths
                                          for the scp subsystem */
        session->kex = NULL;
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "New session resource allocated"));
        _libssh2_init_if_needed();
    }
    return session;
}